

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

Var Js::GlobalObject::EntryUnEscape(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  short sVar4;
  charcount_t cVar5;
  undefined4 *puVar6;
  Var aValue;
  CompoundString *this;
  char16 *pcVar7;
  short sVar8;
  char16 cVar9;
  ushort uVar10;
  char16 *pcVar11;
  char16 *pcVar12;
  int in_stack_00000010;
  JavascriptString *local_48;
  JavascriptString *src;
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x59e,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00a26d2c;
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&src,(CallInfo *)&args.super_Arguments.Values,(Var *)&stack0x00000018
            );
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x5a1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00a26d2c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((uint)src & 0xfffffe) == 0) {
    this = (CompoundString *)
           StringCache::GetUndefinedDisplay
                     (&((pSVar1->super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
  else {
    EnterPinnedScope(&local_48);
    aValue = Arguments::operator[]((Arguments *)&src,1);
    local_48 = JavascriptConversion::ToString(aValue,pSVar1);
    cVar5 = JavascriptString::GetLength(local_48);
    this = CompoundString::NewWithCharCapacity
                     (cVar5,(pSVar1->super_ScriptContextBase).javascriptLibrary);
    pcVar7 = JavascriptString::GetString(local_48);
    cVar5 = JavascriptString::GetLength(local_48);
    pcVar12 = pcVar7;
    while (pcVar12 < pcVar7 + cVar5) {
      pcVar11 = pcVar12 + 1;
      cVar9 = *pcVar12;
      if (cVar9 == L'%') {
        cVar9 = pcVar12[1];
        if (cVar9 == L'u') {
          cVar9 = pcVar12[2];
          if ((ushort)(cVar9 + L'￐') < 10) {
            sVar8 = cVar9 << 0xc;
          }
          else {
            uVar10 = cVar9 + L'﾿';
            if (5 < uVar10) {
              uVar10 = cVar9 + L'ﾟ';
              cVar9 = L'%';
              if (5 < uVar10) goto LAB_00a26cf1;
            }
            sVar8 = uVar10 * 0x1000 + -0x6000;
          }
          cVar9 = pcVar12[3];
          if ((ushort)(cVar9 + L'￐') < 10) {
            sVar4 = (cVar9 + L'￐') * 0x100;
          }
          else {
            uVar10 = cVar9 + L'﾿';
            if (5 < uVar10) {
              uVar10 = cVar9 + L'ﾟ';
              cVar9 = L'%';
              if (5 < uVar10) goto LAB_00a26cf1;
            }
            sVar4 = uVar10 * 0x100 + 0xa00;
          }
          sVar4 = sVar4 + sVar8;
          cVar9 = pcVar12[4];
          pcVar12 = pcVar12 + 5;
        }
        else {
          pcVar12 = pcVar12 + 2;
          sVar4 = 0;
        }
        if ((ushort)(cVar9 + L'￐') < 10) {
          sVar4 = sVar4 + (cVar9 + L'￐') * 0x10;
        }
        else {
          uVar10 = cVar9 + L'﾿';
          if (5 < uVar10) {
            uVar10 = cVar9 + L'ﾟ';
            cVar9 = L'%';
            if (5 < uVar10) goto LAB_00a26cf1;
          }
          sVar4 = sVar4 + uVar10 * 0x10 + 0xa0;
        }
        cVar9 = *pcVar12;
        if ((ushort)(cVar9 + L'￐') < 10) {
          cVar9 = cVar9 + L'￐' + sVar4;
          pcVar11 = pcVar12 + 1;
        }
        else {
          uVar10 = cVar9 + L'﾿';
          if (5 < uVar10) {
            uVar10 = cVar9 + L'ﾟ';
            cVar9 = L'%';
            if (5 < uVar10) goto LAB_00a26cf1;
          }
          cVar9 = sVar4 + uVar10 + L'\n';
          pcVar11 = pcVar12 + 1;
        }
      }
LAB_00a26cf1:
      CompoundString::AppendChars(this,cVar9);
      pcVar12 = pcVar11;
    }
    LeavePinnedScope();
  }
  return this;
}

Assistant:

Var GlobalObject::EntryUnEscape(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }

        char16 chw;
        char16 chT;
        char16 * pchSrc;
        char16 * pchLim;
        char16 * pchMin;

        CompoundString * bs = nullptr;
        ENTER_PINNED_SCOPE(JavascriptString, src);
        src = JavascriptConversion::ToString(args[1], scriptContext);
        bs = CompoundString::NewWithCharCapacity(src->GetLength(), scriptContext->GetLibrary());
        pchSrc = const_cast<char16 *>(src->GetString());
        pchLim = pchSrc + src->GetLength();
        while (pchSrc < pchLim)
        {
            if ('%' != (chT = *pchSrc++))
            {
                bs->AppendChars(chT);
                continue;
            }

            pchMin = pchSrc;
            chT = *pchSrc++;
            if ('u' != chT)
            {
                chw = 0;
                goto LTwoHexDigits;
            }

            // 4 hex digits.
            if ((chT = *pchSrc++ - '0') <= 9)
                chw = chT * 0x1000;
            else if ((chT -= 'A' - '0') <= 5 || (chT -= 'a' - 'A') <= 5)
                chw = (chT + 10) * 0x1000;
            else
                goto LHexError;
            if ((chT = *pchSrc++ - '0') <= 9)
                chw += chT * 0x0100;
            else if ((chT -= 'A' - '0') <= 5 || (chT -= 'a' - 'A') <= 5)
                chw += (chT + 10) * 0x0100;
            else
                goto LHexError;
            chT = *pchSrc++;
LTwoHexDigits:
            if ((chT -= '0') <= 9)
                chw += chT * 0x0010;
            else if ((chT -= 'A' - '0') <= 5 || (chT -= 'a' - 'A') <= 5)
                chw += (chT + 10) * 0x0010;
            else
                goto LHexError;
            if ((chT = *pchSrc++ - '0') <= 9)
                chw += chT;
            else if ((chT -= 'A' - '0') <= 5 || (chT -= 'a' - 'A') <= 5)
                chw += chT + 10;
            else
            {
LHexError:
                pchSrc = pchMin;
                chw = '%';
            }

            bs->AppendChars(chw);
        }
        LEAVE_PINNED_SCOPE();   // src

        return bs;
    }